

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Fire_PDU::Encode(Fire_PDU *this,KDataStream *stream)

{
  Descriptor *pDVar1;
  MunitionDescriptor md;
  MunitionDescriptor local_38;
  
  Warfare_Header::Encode(&this->super_Warfare_Header,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32FireMissionIndex);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Location,stream);
  pDVar1 = (this->m_pDescriptor).m_pRef;
  if (pDVar1 == (Descriptor *)0x0) {
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor(&local_38);
    (*local_38.super_Descriptor.super_DataTypeBase._vptr_DataTypeBase[5])(&local_38,stream);
    DATA_TYPE::Descriptor::~Descriptor(&local_38.super_Descriptor);
  }
  else {
    (*(pDVar1->super_DataTypeBase)._vptr_DataTypeBase[5])(pDVar1,stream);
  }
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32Range);
  return;
}

Assistant:

void Fire_PDU::Encode( KDataStream & stream ) const
{
    Warfare_Header::Encode( stream );
    stream << m_ui32FireMissionIndex
           << KDIS_STREAM m_Location;

    if( !m_pDescriptor.GetPtr() )
    {
        // Create a temp to fill the buffer.
        MunitionDescriptor md;
        stream << KDIS_STREAM md;
    }
    else
    {
        m_pDescriptor->Encode( stream );
    }

    stream << KDIS_STREAM m_Velocity
           << m_f32Range;
}